

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_len(uchar **p,uchar *start,size_t len)

{
  int iVar1;
  uchar *puVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  
  if (len < 0x80) {
    puVar2 = *p;
    if (puVar2 != start && -1 < (long)puVar2 - (long)start) {
      iVar1 = 1;
      goto LAB_0012b105;
    }
  }
  else {
    uVar3 = (uchar)len;
    if (len < 0x100) {
      puVar2 = *p;
      if (1 < (long)puVar2 - (long)start) {
        *p = puVar2 + -1;
        puVar2[-1] = uVar3;
        puVar2 = *p;
        iVar1 = 2;
        len = 0x81;
        goto LAB_0012b105;
      }
    }
    else {
      uVar5 = (uchar)(len >> 8);
      if (len < 0x10000) {
        puVar2 = *p;
        if (2 < (long)puVar2 - (long)start) {
          *p = puVar2 + -1;
          puVar2[-1] = uVar3;
          puVar2 = *p;
          *p = puVar2 + -1;
          puVar2[-1] = uVar5;
          puVar2 = *p;
          iVar1 = 3;
          len = 0x82;
          goto LAB_0012b105;
        }
      }
      else {
        uVar4 = (uchar)(len >> 0x10);
        if (len < 0x1000000) {
          puVar2 = *p;
          if (3 < (long)puVar2 - (long)start) {
            *p = puVar2 + -1;
            puVar2[-1] = uVar3;
            puVar2 = *p;
            *p = puVar2 + -1;
            puVar2[-1] = uVar5;
            puVar2 = *p;
            *p = puVar2 + -1;
            puVar2[-1] = uVar4;
            puVar2 = *p;
            iVar1 = 4;
            len = 0x83;
LAB_0012b105:
            *p = puVar2 + -1;
            puVar2[-1] = (uchar)len;
            return iVar1;
          }
        }
        else {
          if (len >> 0x20 != 0) {
            return -100;
          }
          puVar2 = *p;
          if (4 < (long)puVar2 - (long)start) {
            *p = puVar2 + -1;
            puVar2[-1] = uVar3;
            puVar2 = *p;
            *p = puVar2 + -1;
            puVar2[-1] = uVar5;
            puVar2 = *p;
            *p = puVar2 + -1;
            puVar2[-1] = uVar4;
            puVar2 = *p;
            *p = puVar2 + -1;
            puVar2[-1] = (uchar)(len >> 0x18);
            puVar2 = *p;
            iVar1 = 5;
            len = 0x84;
            goto LAB_0012b105;
          }
        }
      }
    }
  }
  return -0x6c;
}

Assistant:

int mbedtls_asn1_write_len( unsigned char **p, unsigned char *start, size_t len )
{
    if( len < 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        return( 1 );
    }

    if( len <= 0xFF )
    {
        if( *p - start < 2 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        *--(*p) = 0x81;
        return( 2 );
    }

    if( len <= 0xFFFF )
    {
        if( *p - start < 3 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = 0x82;
        return( 3 );
    }

    if( len <= 0xFFFFFF )
    {
        if( *p - start < 4 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = ( len >> 16 ) & 0xFF;
        *--(*p) = 0x83;
        return( 4 );
    }

    if( len <= 0xFFFFFFFF )
    {
        if( *p - start < 5 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = ( len >> 16 ) & 0xFF;
        *--(*p) = ( len >> 24 ) & 0xFF;
        *--(*p) = 0x84;
        return( 5 );
    }

    return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );
}